

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void ForEachSortedOption(TidyDoc tdoc,OptionFunc OptionPrint)

{
  undefined1 local_3e8 [8];
  OptionDesc d;
  TidyOption *topt;
  AllOption_t tOption;
  OptionFunc OptionPrint_local;
  TidyDoc tdoc_local;
  
  tOption.topt[0x67] = (TidyOption)OptionPrint;
  getSortedOption(tdoc,(AllOption_t *)&topt);
  for (d._128_8_ = &topt; *(long *)d._128_8_ != 0; d._128_8_ = d._128_8_ + 8) {
    GetOption(tdoc,*(TidyOption *)d._128_8_,(OptionDesc *)local_3e8);
    (*(code *)tOption.topt[0x67])(tdoc,*(undefined8 *)d._128_8_,local_3e8);
  }
  return;
}

Assistant:

static void ForEachSortedOption(TidyDoc tdoc,          /**< The Tidy document. */
                                OptionFunc OptionPrint /**< The printing function to be used. */
                                )
{
    AllOption_t tOption;
    const TidyOption *topt;

    getSortedOption( tdoc, &tOption );
    for( topt = tOption.topt; *topt; ++topt)
    {
        OptionDesc d;

        GetOption( tdoc, *topt, &d );
        (*OptionPrint)( tdoc, *topt, &d );
    }
}